

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::push_back(SmallVector<Resource,_8UL> *this,Resource *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  char *pcVar3;
  undefined8 *puVar4;
  size_t sVar5;
  undefined8 *puVar6;
  void *pvVar7;
  SPIRVariable *pSVar8;
  undefined8 uVar9;
  size_type sVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  ulong uVar13;
  Resource *pRVar14;
  ulong uVar15;
  Resource *pRVar16;
  size_type *psVar17;
  size_t i;
  ulong uVar18;
  long lVar19;
  
  sVar5 = (this->super_VectorView<Resource>).buffer_size;
  uVar18 = sVar5 + 1;
  if (uVar18 >> 0x3a == 0) {
    uVar15 = this->buffer_capacity;
    if (uVar15 < uVar18) {
      uVar13 = 8;
      if (8 < uVar15) {
        uVar13 = uVar15;
      }
      do {
        uVar15 = uVar13;
        uVar13 = uVar15 * 2;
      } while (uVar15 < uVar18);
      if (uVar15 < 9) {
        pRVar14 = (Resource *)&this->stack_storage;
      }
      else {
        pRVar14 = (Resource *)malloc(uVar15 << 6);
      }
      if (pRVar14 == (Resource *)0x0) goto LAB_001f9f25;
      if ((sVar5 != 0) && (pRVar14 != (this->super_VectorView<Resource>).ptr)) {
        lVar19 = 0x18;
        uVar18 = 0;
        do {
          pcVar3 = (char *)((long)&pRVar14->var + lVar19);
          pRVar16 = (this->super_VectorView<Resource>).ptr;
          puVar4 = (undefined8 *)((long)&pRVar16->var + lVar19);
          *(undefined8 *)((long)pRVar14 + lVar19 + -0x18) =
               *(undefined8 *)((long)pRVar16 + lVar19 + -0x18);
          *(char **)((long)pRVar14 + lVar19 + -0x10) = pcVar3;
          puVar6 = *(undefined8 **)((long)pRVar16 + lVar19 + -0x10);
          if (puVar4 == puVar6) {
            uVar9 = puVar4[1];
            *(undefined8 *)pcVar3 = *puVar4;
            *(undefined8 *)(pcVar3 + 8) = uVar9;
          }
          else {
            *(undefined8 **)((long)pRVar14 + lVar19 + -0x10) = puVar6;
            *(undefined8 *)((long)&pRVar14->var + lVar19) = *puVar4;
          }
          *(undefined8 *)((long)pRVar14 + lVar19 + -8) =
               *(undefined8 *)((long)pRVar16 + lVar19 + -8);
          *(undefined8 **)((long)pRVar16 + lVar19 + -0x10) = puVar4;
          *(undefined8 *)((long)pRVar16 + lVar19 + -8) = 0;
          *(undefined1 *)((long)&pRVar16->var + lVar19) = 0;
          *(undefined4 *)((long)&(pRVar14->name).field_2 + lVar19) =
               *(undefined4 *)((long)&(pRVar16->name).field_2 + lVar19);
          puVar4 = (undefined8 *)((long)&(pRVar16->name)._M_dataplus._M_p + lVar19);
          uVar9 = puVar4[1];
          puVar6 = (undefined8 *)((long)&(pRVar14->name)._M_dataplus._M_p + lVar19);
          *puVar6 = *puVar4;
          puVar6[1] = uVar9;
          pRVar16 = (this->super_VectorView<Resource>).ptr;
          pvVar7 = *(void **)((long)pRVar16 + lVar19 + -0x10);
          if ((void *)((long)&pRVar16->var + lVar19) != pvVar7) {
            operator_delete(pvVar7);
          }
          uVar18 = uVar18 + 1;
          lVar19 = lVar19 + 0x40;
        } while (uVar18 < (this->super_VectorView<Resource>).buffer_size);
      }
      pRVar16 = (this->super_VectorView<Resource>).ptr;
      if (pRVar16 != (Resource *)&this->stack_storage) {
        free(pRVar16);
      }
      (this->super_VectorView<Resource>).ptr = pRVar14;
      this->buffer_capacity = uVar15;
    }
    pRVar14 = (this->super_VectorView<Resource>).ptr;
    sVar5 = (this->super_VectorView<Resource>).buffer_size;
    pRVar16 = pRVar14 + sVar5;
    psVar17 = &(pRVar16->name)._M_string_length;
    pRVar16->var = t->var;
    pRVar16->discrete_descriptor_alias = (SPIRVariable *)psVar17;
    pSVar8 = (SPIRVariable *)(t->name)._M_dataplus._M_p;
    paVar1 = &(t->name).field_2;
    if (pSVar8 == (SPIRVariable *)paVar1) {
      sVar10 = *(size_type *)((long)&(t->name).field_2 + 8);
      *psVar17 = paVar1->_M_allocated_capacity;
      (pRVar16->name).field_2._M_allocated_capacity = sVar10;
    }
    else {
      pRVar14[sVar5].discrete_descriptor_alias = pSVar8;
      pRVar14[sVar5].name._M_string_length = paVar1->_M_allocated_capacity;
    }
    pRVar14[sVar5].name._M_dataplus._M_p = (pointer)(t->name)._M_string_length;
    (t->name)._M_dataplus._M_p = (pointer)paVar1;
    (t->name)._M_string_length = 0;
    (t->name).field_2._M_local_buf[0] = '\0';
    pRVar14[sVar5].plane = t->overlapping_var_id;
    uVar11 = t->plane_count;
    uVar12 = t->plane;
    *(undefined8 *)((long)&pRVar14[sVar5].name.field_2 + 8) = *(undefined8 *)&t->basetype;
    pRVar14[sVar5].basetype = uVar11;
    pRVar14[sVar5].index = uVar12;
    psVar2 = &(this->super_VectorView<Resource>).buffer_size;
    *psVar2 = *psVar2 + 1;
    return;
  }
LAB_001f9f25:
  ::std::terminate();
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}